

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this,ActionMessage *val)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> pushLock;
  value_type *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,(mutex_type *)in_stack_ffffffffffffffa8);
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unlock(in_RDI);
    std::unique_lock<std::mutex>::unique_lock(in_RDI,(mutex_type *)in_stack_ffffffffffffffa8);
    bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                      (in_stack_ffffffffffffffc0);
    if (bVar1) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)in_RDI,
                 in_stack_ffffffffffffffa8);
      std::atomic<bool>::store
                ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
    }
    else {
      std::unique_lock<std::mutex>::lock(in_RDI);
    }
    uVar2 = (uint)bVar1;
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
    if (uVar2 != 0) goto LAB_0049cea6;
  }
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)in_RDI,
             in_stack_ffffffffffffffa8);
LAB_0049cea6:
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                pushLock.unlock();
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                if (pullElements.empty()) {
                    pullElements.push_back(std::forward<Z>(val));
                    queueEmptyFlag.store(false);
                    return;
                }
                // reengage the push lock so we can push next
                // LCOV_EXCL_START
                pushLock.lock();
                // LCOV_EXCL_STOP
            }
            pushElements.push_back(std::forward<Z>(val));
        }